

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O1

bool anon_unknown.dwarf_82cecd::VariableValueHelper(string *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  cmJSONState *local_28;
  Value *local_20;
  
  if (value == (Value *)0x0) {
    out->_M_string_length = 0;
    *(out->_M_dataplus)._M_p = '\0';
  }
  else {
    bVar1 = Json::Value::isBool(value);
    if (!bVar1) {
      local_28 = state;
      local_20 = value;
      if ((anonymous_namespace)::VariableStringHelper_abi_cxx11_._16_8_ != 0) {
        uVar2 = (*(code *)(anonymous_namespace)::VariableStringHelper_abi_cxx11_._24_8_)
                          ((anonymous_namespace)::VariableStringHelper_abi_cxx11_,out,&local_20,
                           &local_28);
        return (bool)uVar2;
      }
      std::__throw_bad_function_call();
    }
    bVar1 = Json::Value::asBool(value);
    pcVar3 = "FALSE";
    if (bVar1) {
      pcVar3 = "TRUE";
    }
    std::__cxx11::string::_M_replace((ulong)out,0,(char *)out->_M_string_length,(ulong)pcVar3);
  }
  return true;
}

Assistant:

bool VariableValueHelper(std::string& out, const Json::Value* value,
                         cmJSONState* state)
{
  if (!value) {
    out.clear();
    return true;
  }

  if (value->isBool()) {
    out = value->asBool() ? "TRUE" : "FALSE";
    return true;
  }

  return VariableStringHelper(out, value, state);
}